

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_scatterplot.cpp
# Opt level: O1

Reals Omega_h::get_linear_scatter_coords<3>(Reals coords,Vector<3> direction,Vector<3> origin)

{
  int *piVar1;
  ulong *puVar2;
  Alloc *pAVar3;
  undefined8 uVar4;
  Int i;
  long lVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar6;
  ulong *puVar7;
  int iVar8;
  ulong uVar9;
  double dVar10;
  Reals RVar11;
  type_conflict1 f;
  Write<double> local_98;
  double local_88;
  Write<double> local_78;
  undefined1 local_68 [32];
  double local_48;
  double local_40;
  Alloc *local_38;
  void *local_30;
  
  puVar7 = coords.write_.shared_alloc_.direct_ptr;
  local_88 = origin.super_Few<double,_3>.array_[2];
  local_98.shared_alloc_.alloc = (Alloc *)origin.super_Few<double,_3>.array_[0];
  local_98.shared_alloc_.direct_ptr = (void *)origin.super_Few<double,_3>.array_[1];
  local_68._0_8_ = direction.super_Few<double,_3>.array_[0];
  local_68._8_8_ = direction.super_Few<double,_3>.array_[1];
  local_68._16_8_ = direction.super_Few<double,_3>.array_[2];
  dVar10 = origin.super_Few<double,_3>.array_[0] * direction.super_Few<double,_3>.array_[0];
  lVar5 = 1;
  do {
    dVar10 = dVar10 + (double)(&local_98.shared_alloc_.alloc)[lVar5] *
                      *(double *)(local_68 + lVar5 * 8);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  puVar2 = (ulong *)*puVar7;
  if (((ulong)puVar2 & 1) == 0) {
    uVar9 = *puVar2;
  }
  else {
    uVar9 = (ulong)puVar2 >> 3;
  }
  iVar8 = (int)(uVar9 >> 3);
  if (iVar8 * -0x55555555 + 0x2aaaaaaaU < 0x55555555) {
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"");
    iVar8 = iVar8 / 3;
    Write<double>::Write(&local_98,iVar8,(string *)local_68);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    local_68._0_8_ = *puVar7;
    if ((local_68._0_8_ & 7) == 0 && (Alloc *)local_68._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68._0_8_ = ((Alloc *)local_68._0_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_68._0_8_)->use_count = ((Alloc *)local_68._0_8_)->use_count + 1;
      }
    }
    local_68._8_8_ = puVar7[1];
    local_68._16_8_ = direction.super_Few<double,_3>.array_[0];
    local_68._24_8_ = direction.super_Few<double,_3>.array_[1];
    local_48 = direction.super_Few<double,_3>.array_[2];
    local_38 = local_98.shared_alloc_.alloc;
    if (((ulong)local_98.shared_alloc_.alloc & 7) == 0 &&
        local_98.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_38 = (Alloc *)((local_98.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_98.shared_alloc_.alloc)->use_count = (local_98.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_30 = local_98.shared_alloc_.direct_ptr;
    local_40 = dVar10;
    parallel_for<Omega_h::get_linear_scatter_coords<3>(Omega_h::Read<double>,Omega_h::Vector<3>,Omega_h::Vector<3>)::_lambda(int)_1_&>
              (iVar8,(type_conflict1 *)local_68);
    local_78.shared_alloc_.alloc = local_98.shared_alloc_.alloc;
    local_78.shared_alloc_.direct_ptr = local_98.shared_alloc_.direct_ptr;
    if ((((ulong)local_98.shared_alloc_.alloc & 7) == 0 &&
         local_98.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_98.shared_alloc_.alloc)->use_count = (local_98.shared_alloc_.alloc)->use_count + -1;
      local_78.shared_alloc_.alloc = (Alloc *)((local_98.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_98.shared_alloc_.alloc = (Alloc *)0x0;
    local_98.shared_alloc_.direct_ptr = (void *)0x0;
    Read<double>::Read((Read<signed_char> *)coords.write_.shared_alloc_.alloc,&local_78);
    pAVar3 = local_78.shared_alloc_.alloc;
    pvVar6 = extraout_RDX;
    if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
        local_78.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_78.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_78.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
        pvVar6 = extraout_RDX_00;
      }
    }
    pAVar3 = local_38;
    if (((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) {
      piVar1 = &local_38->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_38);
        operator_delete(pAVar3,0x48);
        pvVar6 = extraout_RDX_01;
      }
    }
    uVar4 = local_68._0_8_;
    if ((local_68._0_8_ & 7) == 0 && (Alloc *)local_68._0_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_68._0_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_68._0_8_);
        operator_delete((void *)uVar4,0x48);
        pvVar6 = extraout_RDX_02;
      }
    }
    pAVar3 = local_98.shared_alloc_.alloc;
    if (((ulong)local_98.shared_alloc_.alloc & 7) == 0 &&
        local_98.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_98.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_98.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
        pvVar6 = extraout_RDX_03;
      }
    }
    RVar11.write_.shared_alloc_.direct_ptr = pvVar6;
    RVar11.write_.shared_alloc_.alloc = coords.write_.shared_alloc_.alloc;
    return (Reals)RVar11.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a % b == 0",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
       ,0x11a);
}

Assistant:

Reals get_linear_scatter_coords(
    Reals coords, Vector<dim> direction, Vector<dim> origin) {
  auto offset = origin * direction;
  auto n = divide_no_remainder(coords.size(), dim);
  auto coords_1d_w = Write<Real>(n);
  auto f = OMEGA_H_LAMBDA(LO i) {
    auto x = get_vector<dim>(coords, i);
    auto d = x * direction - offset;
    coords_1d_w[i] = d;
  };
  parallel_for(n, f);
  return coords_1d_w;
}